

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O0

uint Lpk_ComputeSets(Kit_DsdNtk_t *p,Vec_Int_t *vSets)

{
  int iVar1;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  int local_30;
  int i;
  int Number;
  uint Entry;
  uint uSupport;
  Vec_Int_t *vSets_local;
  Kit_DsdNtk_t *p_local;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                  ,0x70,"unsigned int Lpk_ComputeSets(Kit_DsdNtk_t *, Vec_Int_t *)");
  }
  Vec_IntClear(vSets);
  Vec_IntPush(vSets,0);
  pKVar3 = Kit_DsdNtkRoot(p);
  if (((uint)*pKVar3 >> 6 & 7) == 1) {
    p_local._4_4_ = 0;
  }
  else {
    pKVar3 = Kit_DsdNtkRoot(p);
    if (((uint)*pKVar3 >> 6 & 7) == 2) {
      pKVar3 = Kit_DsdNtkRoot(p);
      iVar1 = Abc_Lit2Var((uint)*(ushort *)(pKVar3 + 1));
      p_local._4_4_ = 1 << ((byte)iVar1 & 0x1f);
      Vec_IntPush(vSets,p_local._4_4_);
    }
    else {
      p_local._4_4_ = Lpk_ComputeSets_rec(p,(uint)p->Root,vSets);
      if ((p_local._4_4_ & 0xffff0000) != 0) {
        __assert_fail("(uSupport & 0xFFFF0000) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                      ,0x7c,"unsigned int Lpk_ComputeSets(Kit_DsdNtk_t *, Vec_Int_t *)");
      }
      Vec_IntPush(vSets,p_local._4_4_);
      for (local_30 = 0; iVar1 = Vec_IntSize(vSets), local_30 < iVar1; local_30 = local_30 + 1) {
        uVar2 = Vec_IntEntry(vSets,local_30);
        Vec_IntWriteEntry(vSets,local_30,uVar2 | (p_local._4_4_ & (uVar2 ^ 0xffffffff)) << 0x10);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

unsigned Lpk_ComputeSets( Kit_DsdNtk_t * p, Vec_Int_t * vSets )
{
    unsigned uSupport, Entry;
    int Number, i;
    assert( p->nVars <= 16 );
    Vec_IntClear( vSets );
    Vec_IntPush( vSets, 0 );
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        uSupport = ( 1 << Abc_Lit2Var(Kit_DsdNtkRoot(p)->pFans[0]) );
        Vec_IntPush( vSets, uSupport );
        return uSupport;
    }
    uSupport = Lpk_ComputeSets_rec( p, p->Root, vSets );
    assert( (uSupport & 0xFFFF0000) == 0 );
    Vec_IntPush( vSets, uSupport );
    // set the remaining variables
    Vec_IntForEachEntry( vSets, Number, i )
    {
        Entry = Number;
        Vec_IntWriteEntry( vSets, i, Entry | ((uSupport & ~Entry) << 16) );
    }
    return uSupport;
}